

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O0

void __thiscall
LinuxEvents<0>::end(LinuxEvents<0> *this,
                   vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *results)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  ssize_t sVar5;
  reference pvVar6;
  LinuxEvents<0> *in_RSI;
  int *in_RDI;
  uint32_t i;
  uint local_70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  iVar2 = ioctl(*in_RDI,0x2401,1);
  if (iVar2 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"ioctl(PERF_EVENT_IOC_DISABLE)",&local_31);
    report_error(in_RSI,in_stack_ffffffffffffffe8);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  iVar2 = *in_RDI;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24),0);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24));
  sVar5 = read(iVar2,pvVar3,sVar4 << 3);
  if (sVar5 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"read",&local_69);
    report_error(in_RSI,in_stack_ffffffffffffffe8);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  local_70 = 1;
  while( true ) {
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24));
    if (sVar4 <= local_70) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24),
                        (ulong)local_70);
    vVar1 = *pvVar3;
    pvVar6 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)in_RSI,
                        (ulong)(local_70 >> 1));
    *pvVar6 = vVar1;
    local_70 = local_70 + 2;
  }
  return;
}

Assistant:

inline void end(std::vector<unsigned long long> &results) {
    if (ioctl(fd, PERF_EVENT_IOC_DISABLE, PERF_IOC_FLAG_GROUP) == -1) {
      report_error("ioctl(PERF_EVENT_IOC_DISABLE)");
    }

    if (read(fd, &temp_result_vec[0], temp_result_vec.size() * 8) == -1) {
      report_error("read");
    }
    // our actual results are in slots 1,3,5, ... of this structure
    // we really should be checking our ids obtained earlier to be safe
    for (uint32_t i = 1; i < temp_result_vec.size(); i += 2) {
      results[i / 2] = temp_result_vec[i];
    }
  }